

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::BitImage::resize(BitImage *this,uint32_t w,uint32_t h,bool discard)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  uint local_4c;
  uint32_t i;
  uint32_t height;
  undefined1 local_38 [8];
  Array<unsigned_long> tmp;
  uint32_t rowStride;
  uint32_t uStack_14;
  bool discard_local;
  uint32_t h_local;
  uint32_t w_local;
  BitImage *this_local;
  
  tmp.m_base.capacity = w + 0x3f >> 6;
  tmp.m_base._23_1_ = discard;
  rowStride = h;
  uStack_14 = w;
  _h_local = this;
  if (discard) {
    Array<unsigned_long>::resize(&this->m_data,tmp.m_base.capacity * h);
    Array<unsigned_long>::zeroOutMemory(&this->m_data);
  }
  else {
    Array<unsigned_long>::Array((Array<unsigned_long> *)local_38,0);
    Array<unsigned_long>::resize((Array<unsigned_long> *)local_38,tmp.m_base.capacity * rowStride);
    puVar4 = Array<unsigned_long>::data((Array<unsigned_long> *)local_38);
    uVar1 = Array<unsigned_long>::size((Array<unsigned_long> *)local_38);
    memset(puVar4,0,(ulong)uVar1 << 3);
    if (tmp.m_base.capacity == this->m_rowStride) {
      puVar4 = Array<unsigned_long>::data((Array<unsigned_long> *)local_38);
      puVar5 = Array<unsigned_long>::data(&this->m_data);
      uVar1 = this->m_rowStride;
      uVar2 = min<unsigned_int>(&this->m_height,&rowStride);
      memcpy(puVar4,puVar5,(ulong)(uVar1 * uVar2) << 3);
    }
    else if ((this->m_width != 0) && (this->m_height != 0)) {
      uVar2 = min<unsigned_int>(&this->m_height,&rowStride);
      for (local_4c = 0; local_4c < uVar2; local_4c = local_4c + 1) {
        puVar4 = Array<unsigned_long>::operator[]
                           ((Array<unsigned_long> *)local_38,local_4c * tmp.m_base.capacity);
        puVar5 = Array<unsigned_long>::operator[](&this->m_data,local_4c * this->m_rowStride);
        uVar3 = min<unsigned_int>(&tmp.m_base.capacity,&this->m_rowStride);
        memcpy(puVar4,puVar5,(ulong)uVar3 << 3);
      }
    }
    Array<unsigned_long>::moveTo((Array<unsigned_long> *)local_38,&this->m_data);
    Array<unsigned_long>::~Array((Array<unsigned_long> *)local_38);
  }
  this->m_width = uStack_14;
  this->m_height = rowStride;
  this->m_rowStride = tmp.m_base.capacity;
  return;
}

Assistant:

void resize(uint32_t w, uint32_t h, bool discard)
	{
		const uint32_t rowStride = (w + 63) >> 6;
		if (discard) {
			m_data.resize(rowStride * h);
			m_data.zeroOutMemory();
		} else {
			Array<uint64_t> tmp;
			tmp.resize(rowStride * h);
			memset(tmp.data(), 0, tmp.size() * sizeof(uint64_t));
			// If only height has changed, can copy all rows at once.
			if (rowStride == m_rowStride) {
				memcpy(tmp.data(), m_data.data(), m_rowStride * min(m_height, h) * sizeof(uint64_t));
			} else if (m_width > 0 && m_height > 0) {
				const uint32_t height = min(m_height, h);
				for (uint32_t i = 0; i < height; i++)
					memcpy(&tmp[i * rowStride], &m_data[i * m_rowStride], min(rowStride, m_rowStride) * sizeof(uint64_t));
			}
			tmp.moveTo(m_data);
		}
		m_width = w;
		m_height = h;
		m_rowStride = rowStride;
	}